

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O3

shared_ptr<helics::apps::App>
anon_unknown.dwarf_110546::buildApp(string_view type,string_view appName,FederateInfo *fedInfo)

{
  _Atomic_word *p_Var1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *extraout_RAX_01;
  undefined4 extraout_var_00;
  element_type *extraout_RAX_02;
  undefined4 extraout_var_01;
  element_type *extraout_RAX_03;
  element_type *extraout_RAX_04;
  element_type *extraout_RAX_05;
  element_type *extraout_RAX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__s1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  undefined4 *puVar6;
  FederateInfo *in_R9;
  shared_ptr<helics::apps::App> sVar7;
  undefined1 local_39;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type._M_str;
  puVar6 = (undefined4 *)type._M_len;
  local_28._M_len = (size_t)appName._M_str;
  __s1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)appName._M_len;
  p_Var1 = &__n[-1]._M_weak_count;
  peVar4 = (element_type *)p_Var1;
  _Var5._M_pi = __s1;
  if (p_Var1 < (_Atomic_word *)0x6) {
    peVar4 = (element_type *)
             ((long)&switchD_001b2726::switchdataD_0042a638 +
             (long)(int)(&switchD_001b2726::switchdataD_0042a638)[(long)p_Var1]);
    _Var5._M_pi = __n;
    local_28._M_str = (char *)fedInfo;
    switch(p_Var1) {
    case (_Atomic_word *)0x0:
      iVar3 = bcmp(__s1,"echo",(size_t)__n);
      peVar4 = (element_type *)CONCAT44(extraout_var,iVar3);
      _Var5._M_pi = extraout_RDX;
      if (iVar3 != 0) goto switchD_001b2726_caseD_3;
      local_38 = (Recorder *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::Echo,std::allocator<helics::apps::Echo>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (&_Stack_30,(Echo **)&local_38,(allocator<helics::apps::Echo> *)&local_39,&local_28,
                 in_R9);
      peVar4 = extraout_RAX;
      _Var5._M_pi = extraout_RDX_00;
      break;
    case (_Atomic_word *)0x1:
      iVar3 = bcmp(__s1,"clone",(size_t)__n);
      if (iVar3 == 0) {
        local_38 = (Recorder *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<helics::apps::Clone,std::allocator<helics::apps::Clone>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                  (&_Stack_30,(Clone **)&local_38,(allocator<helics::apps::Clone> *)&local_39,
                   &local_28,in_R9);
        peVar4 = extraout_RAX_04;
        _Var5._M_pi = extraout_RDX_09;
      }
      else {
        uVar2 = *(uint *)&__s1->_vptr__Sp_counted_base ^ 0x626f7270;
        peVar4 = (element_type *)(ulong)uVar2;
        _Var5._M_pi = extraout_RDX_03;
        if (*(char *)((long)&__s1->_vptr__Sp_counted_base + 4) != 'e' || uVar2 != 0)
        goto switchD_001b2726_caseD_3;
        local_38 = (Recorder *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<helics::apps::Probe,std::allocator<helics::apps::Probe>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                  (&_Stack_30,(Probe **)&local_38,(allocator<helics::apps::Probe> *)&local_39,
                   &local_28,in_R9);
        peVar4 = extraout_RAX_01;
        _Var5._M_pi = extraout_RDX_04;
      }
      break;
    case (_Atomic_word *)0x2:
      if (*(short *)((long)&__s1->_vptr__Sp_counted_base + 4) == 0x7265 &&
          *(int *)&__s1->_vptr__Sp_counted_base == 0x79616c70) {
        local_38 = (Recorder *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<helics::apps::Player,std::allocator<helics::apps::Player>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                  (&_Stack_30,(Player **)&local_38,(allocator<helics::apps::Player> *)&local_39,
                   &local_28,in_R9);
        peVar4 = extraout_RAX_03;
        _Var5._M_pi = extraout_RDX_08;
      }
      else {
        iVar3 = bcmp(__s1,"tracer",(size_t)__n);
        if (iVar3 == 0) {
          local_38 = (Recorder *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<helics::apps::Tracer,std::allocator<helics::apps::Tracer>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                    (&_Stack_30,(Tracer **)&local_38,(allocator<helics::apps::Tracer> *)&local_39,
                     &local_28,in_R9);
          peVar4 = extraout_RAX_06;
          _Var5._M_pi = extraout_RDX_11;
        }
        else {
          uVar2 = *(uint *)&__s1->_vptr__Sp_counted_base ^ 0x72756f73;
          peVar4 = (element_type *)(ulong)uVar2;
          _Var5._M_pi = extraout_RDX_01;
          if (*(short *)((long)&__s1->_vptr__Sp_counted_base + 4) != 0x6563 || uVar2 != 0)
          goto switchD_001b2726_caseD_3;
          local_38 = (Recorder *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<helics::apps::Source,std::allocator<helics::apps::Source>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                    (&_Stack_30,(Source **)&local_38,(allocator<helics::apps::Source> *)&local_39,
                     &local_28,in_R9);
          peVar4 = extraout_RAX_00;
          _Var5._M_pi = extraout_RDX_02;
        }
      }
      break;
    case (_Atomic_word *)0x3:
      goto switchD_001b2726_caseD_3;
    case (_Atomic_word *)0x4:
      iVar3 = bcmp(__s1,"recorder",(size_t)__n);
      peVar4 = (element_type *)CONCAT44(extraout_var_00,iVar3);
      _Var5._M_pi = extraout_RDX_05;
      if (iVar3 != 0) goto switchD_001b2726_caseD_3;
      local_38 = (Recorder *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::Recorder,std::allocator<helics::apps::Recorder>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (&_Stack_30,(Recorder **)&local_38,(allocator<helics::apps::Recorder> *)&local_39,
                 &local_28,in_R9);
      peVar4 = extraout_RAX_02;
      _Var5._M_pi = extraout_RDX_06;
      break;
    case (_Atomic_word *)0x5:
      iVar3 = bcmp(__s1,"connector",(size_t)__n);
      peVar4 = (element_type *)CONCAT44(extraout_var_01,iVar3);
      _Var5._M_pi = extraout_RDX_07;
      if (iVar3 != 0) goto switchD_001b2726_caseD_3;
      local_38 = (Recorder *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::Connector,std::allocator<helics::apps::Connector>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (&_Stack_30,(Connector **)&local_38,(allocator<helics::apps::Connector> *)&local_39,
                 &local_28,in_R9);
      peVar4 = extraout_RAX_05;
      _Var5._M_pi = extraout_RDX_10;
    }
  }
  else {
switchD_001b2726_caseD_3:
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    _Stack_30._M_pi._0_4_ = 0;
    _Stack_30._M_pi._4_4_ = 0;
  }
  *puVar6 = (undefined4)local_38;
  puVar6[1] = local_38._4_4_;
  puVar6[2] = _Stack_30._M_pi._0_4_;
  puVar6[3] = _Stack_30._M_pi._4_4_;
  sVar7.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar7.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  return (shared_ptr<helics::apps::App>)
         sVar7.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helics::apps::App> buildApp(std::string_view type, std::string_view appName, helics::FederateInfo& fedInfo)
{
    if (type == "player") {
        return std::make_shared<helics::apps::Player>(appName, fedInfo);
    }
    if (type == "recorder") {
        return std::make_shared<helics::apps::Recorder>(appName, fedInfo);
    }
    if (type == "connector") {
        return std::make_shared<helics::apps::Connector>(appName, fedInfo);
    }
    if (type == "echo") {
        return std::make_shared<helics::apps::Echo>(appName, fedInfo);
    }
    if (type == "clone") {
        return std::make_shared<helics::apps::Clone>(appName, fedInfo);
    }
    if (type == "probe") {
        return std::make_shared<helics::apps::Probe>(appName, fedInfo);
    }
    if (type == "tracer") {
        return std::make_shared<helics::apps::Tracer>(appName, fedInfo);
    }
    if (type == "source") {
        return std::make_shared<helics::apps::Source>(appName, fedInfo);
    }
    return nullptr;
}